

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature_advanced.c
# Opt level: O3

int main(int argc,char **args)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  FILE *__s;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar4;
  size_t sVar5;
  extractor_fn p_Var6;
  void *__s_00;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  light_pcapng pcapng;
  light_option p_Var10;
  uint32_t *puVar11;
  uint64_t uVar12;
  long lVar13;
  long lVar14;
  char *__ptr;
  long lVar15;
  long lVar16;
  char **ppcVar17;
  ulong uVar18;
  extractor_fn *pp_Var19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong local_278;
  undefined8 local_240;
  uint64_t feature_values [64];
  
  local_240 = args;
  __s = fopen("features/unscaled.csv","w");
  __stream = fopen("features/raw.dat","w");
  iVar2 = system("make -C features");
  if (iVar2 == 0) {
    feature_lib_handle = (void *)dlopen("./features/libfeatures.so",1);
    if (feature_lib_handle == (void *)0x0) {
      main_cold_2();
    }
    else {
      __stream_00 = fopen("features/feature_list.txt","r");
      if (__stream_00 != (FILE *)0x0) {
        memset(feature_values,0,0x100);
        pcVar4 = fgets((char *)feature_values,0x100,__stream_00);
        while (pcVar4 != (char *)0x0) {
          sVar5 = strlen((char *)feature_values);
          if (*(char *)((sVar5 - 1) + (long)feature_values) == '\n') {
            *(undefined1 *)((long)feature_values + (sVar5 - 1)) = 0;
          }
          p_Var6 = (extractor_fn)dlsym(feature_lib_handle);
          iVar2 = feature_count;
          if (p_Var6 == (extractor_fn)0x0) {
            fprintf(_stderr,"Unable to find symbol %s\n",feature_values);
          }
          else {
            lVar15 = (long)feature_count;
            features[lVar15] = p_Var6;
            pcVar4 = strdup((char *)feature_values);
            feature_names[lVar15] = pcVar4;
            feature_count = iVar2 + 1;
          }
          memset(feature_values,0,0x100);
          pcVar4 = fgets((char *)feature_values,0x100,__stream_00);
        }
        fclose(__stream_00);
        sVar5 = (size_t)feature_count;
        __s_00 = calloc(sVar5,8);
        memset(__s_00,0xff,sVar5 * 8);
        pvVar7 = calloc(sVar5,8);
        uVar3 = argc - 1;
        pvVar8 = calloc((long)(int)uVar3,8);
        if (1 < argc) {
          uVar18 = 0;
          do {
            pvVar9 = calloc(sVar5,8);
            *(void **)((long)pvVar8 + uVar18 * 8) = pvVar9;
            uVar18 = uVar18 + 1;
          } while (uVar3 != uVar18);
        }
        fwrite("address1, address2",0x12,1,__s);
        if (0 < feature_count) {
          ppcVar17 = feature_names;
          lVar15 = 0;
          do {
            fprintf(__s,", %s",*ppcVar17);
            lVar15 = lVar15 + 1;
            ppcVar17 = ppcVar17 + 1;
          } while (lVar15 < feature_count);
        }
        fputc(10,__s);
        printf("Running feature extraction with %d functions and %d traces\n",
               (ulong)(uint)feature_count,(ulong)uVar3);
        if (argc < 2) {
          fclose(__s);
          puts("Start exporting double features!");
          fprintf(__stream,"%% %d features\n",(ulong)(uint)feature_count);
          fprintf(__stream,"%% %d items\n",(ulong)uVar3);
        }
        else {
          uVar18 = 1;
          do {
            pcVar4 = local_240[uVar18];
            pcapng = light_read_from_path(pcVar4);
            if (pcapng == (light_pcapng)0x0) {
              fprintf(_stderr,"Unable to read pcapng: %s\n",pcVar4);
            }
            else {
              p_Var10 = light_get_option(pcapng,0xadd4);
              if (p_Var10 == (light_option)0x0) {
LAB_00102871:
                sVar5 = 0x10;
                __ptr = "unknown, unknown";
LAB_00102895:
                fwrite(__ptr,sVar5,1,__s);
              }
              else {
                puVar11 = light_get_option_data(p_Var10);
                if ((char)*puVar11 == '\x06') {
                  sVar5 = 10;
                  __ptr = "ipv6, ipv6";
                  goto LAB_00102895;
                }
                if ((char)*puVar11 != '\x04') goto LAB_00102871;
                fprintf(__s,"%u.%u.%u.%u, %u.%u.%u.%u",(ulong)*(byte *)((long)puVar11 + 1),
                        (ulong)*(byte *)((long)puVar11 + 2),(ulong)*(byte *)((long)puVar11 + 3),
                        (ulong)(byte)puVar11[1],(ulong)*(byte *)((long)puVar11 + 5),
                        (ulong)*(byte *)((long)puVar11 + 6),(ulong)*(byte *)((long)puVar11 + 7),
                        (ulong)(byte)puVar11[2]);
              }
              printf("Extract features for %s\n",pcVar4);
              if (0 < feature_count) {
                pp_Var19 = features;
                lVar15 = 0;
                do {
                  uVar12 = (**pp_Var19)(pcapng);
                  feature_values[lVar15] = uVar12;
                  fprintf(__s,", %lu",uVar12);
                  uVar1 = feature_values[lVar15];
                  *(ulong *)(*(long *)((long)pvVar8 + uVar18 * 8 + -8) + lVar15 * 8) = uVar1;
                  if (uVar1 != 0xffffffffffffffff) {
                    if (uVar1 < *(ulong *)((long)__s_00 + lVar15 * 8)) {
                      *(ulong *)((long)__s_00 + lVar15 * 8) = uVar1;
                    }
                    if (*(ulong *)((long)pvVar7 + lVar15 * 8) < uVar1) {
                      *(ulong *)((long)pvVar7 + lVar15 * 8) = uVar1;
                    }
                  }
                  lVar15 = lVar15 + 1;
                  pp_Var19 = pp_Var19 + 1;
                } while (lVar15 < feature_count);
              }
              fputc(10,__s);
              p_Var10 = light_create_option(100,(uint16_t)(feature_count << 3),feature_values);
              light_update_option(pcapng,pcapng,p_Var10);
              light_pcapng_to_file(pcVar4,pcapng);
              light_free_option(p_Var10);
              light_pcapng_release(pcapng);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != (uint)argc);
          fclose(__s);
          puts("Start exporting double features!");
          fprintf(__stream,"%% %d features\n",(ulong)(uint)feature_count);
          fprintf(__stream,"%% %d items\n",(ulong)uVar3);
          if (1 < argc) {
            local_278 = 0;
            do {
              if (0 < feature_count) {
                lVar15 = *(long *)((long)pvVar8 + local_278 * 8);
                lVar16 = 0;
                do {
                  lVar13 = *(long *)(lVar15 + lVar16 * 8);
                  if (lVar13 == -1) {
                    dVar20 = 0.0;
                  }
                  else {
                    lVar14 = *(long *)((long)__s_00 + lVar16 * 8);
                    lVar13 = lVar13 - lVar14;
                    auVar21._8_4_ = (int)((ulong)lVar13 >> 0x20);
                    auVar21._0_8_ = lVar13;
                    auVar21._12_4_ = 0x45300000;
                    lVar14 = *(long *)((long)pvVar7 + lVar16 * 8) - lVar14;
                    auVar22._8_4_ = (int)((ulong)lVar14 >> 0x20);
                    auVar22._0_8_ = lVar14;
                    auVar22._12_4_ = 0x45300000;
                    dVar20 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                             ((auVar22._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
                  }
                  fprintf(__stream,"%.6lf ",dVar20);
                  lVar16 = lVar16 + 1;
                } while (lVar16 < feature_count);
              }
              fputc(10,__stream);
              local_278 = local_278 + 1;
            } while (local_278 != uVar3);
          }
        }
        fclose(__stream);
        lVar15 = (long)feature_count;
        if (0 < lVar15) {
          lVar16 = 0;
          do {
            free(*(void **)((long)feature_names + lVar16));
            lVar16 = lVar16 + 8;
          } while (lVar15 * 8 != lVar16);
        }
        dlclose(feature_lib_handle);
        feature_lib_handle = (void *)0x0;
        return 0;
      }
      perror("Unable to open feature_list.txt");
    }
    main_cold_3();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, const char **args) {
	int i, j;
	FILE *features_csv = fopen("features/unscaled.csv", "w");
	FILE *features_raw = fopen("features/raw.dat", "w");
	uint64_t *min_features = NULL;
	uint64_t *max_features = NULL;
	uint64_t **feature_table = NULL;

	if (compile_features() != 0) {
		fprintf(stderr, "Unable to compile features!\n");
		return EXIT_FAILURE;
	}

	if (extract_features() != 0) {
		fprintf(stderr, "Unable to extract function pointers!\n");
		return EXIT_FAILURE;
	}

	min_features = calloc(feature_count, sizeof(uint64_t));
	memset(min_features, -1, feature_count * sizeof(uint64_t));

	max_features = calloc(feature_count, sizeof(uint64_t));
	feature_table = calloc(argc - 1, sizeof(uint64_t *));
	for (i = 0; i < argc - 1; ++i) {
		feature_table[i] = calloc(feature_count, sizeof(uint64_t));
	}

	fprintf(features_csv, "address1, address2");
	for (i = 0; i < feature_count; ++i) {
		fprintf(features_csv, ", %s", feature_names[i]);
	}
	fprintf(features_csv, "\n");

	printf("Running feature extraction with %d functions and %d traces\n", feature_count, argc - 1);

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			uint64_t feature_values[MAX_FEATURES];
			light_option feature_option;
			light_option address_option;

			address_option = light_get_option(pcapng, LIGHT_CUSTOM_OPTION_ADDRESS_INFO);
			if (address_option != NULL) {
				uint8_t *label = (uint8_t *)light_get_option_data(address_option);
				if (*label == 4) {
					uint8_t source[4], destination[4];
					memcpy(source, label + 1, sizeof(uint32_t));
					memcpy(destination, label + 5, sizeof(uint32_t));
					fprintf(features_csv, "%u.%u.%u.%u, %u.%u.%u.%u",
							source[0], source[1], source[2], source[3],
							destination[0], destination[1], destination[2], destination[3]);
				}
				else if (*label == 6) {
					fprintf(features_csv, "ipv6, ipv6");
				}
				else {
					fprintf(features_csv, "unknown, unknown");
				}
			}
			else {
				fprintf(features_csv, "unknown, unknown");
			}

			printf("Extract features for %s\n", file);

			// Write output to file.
			for (j = 0; j < feature_count; ++j) {
				feature_values[j] = features[j](pcapng);
				fprintf(features_csv, ", %lu", feature_values[j]);

				// Save for later.
				feature_table[i - 1][j] = feature_values[j];

				if (feature_values[j] == -1) {
					// Invalid value.
					continue;
				}

				if (min_features[j] > feature_table[i - 1][j]) {
					min_features[j] = feature_table[i - 1][j];
				}
				if (max_features[j] < feature_table[i - 1][j]) {
					max_features[j] = feature_table[i - 1][j];
				}
			}
			fprintf(features_csv, "\n");

			// Update .pcapng traces with computed metrics.
			feature_option = light_create_option(LIGHT_CUSTOM_OPTION_FEATURE_U64, feature_count * sizeof(uint64_t), feature_values);
			light_update_option(pcapng, pcapng, feature_option);
			light_pcapng_to_file(file, pcapng);

			light_free_option(feature_option);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	fclose(features_csv);

	//////////////////////////////////////////////////////////////////////////////////////////////////////
	printf("Start exporting double features!\n");

	fprintf(features_raw, "%% %d features\n", feature_count);
	fprintf(features_raw, "%% %d items\n", argc - 1);

	for (i = 0; i < argc - 1; ++i) {
		for (j = 0; j < feature_count; ++j) {
			if (feature_table[i][j] == -1) {
				// Invalid feature.
				fprintf(features_raw, "%.6lf ", 0.0);
			}
			else {
				double f = (double)(feature_table[i][j] - min_features[j]) / (max_features[j] - min_features[j]);
				fprintf(features_raw, "%.6lf ", f);
			}
		}
		fprintf(features_raw, "\n");
	}
	fclose(features_raw);

	cleanup();

	return EXIT_SUCCESS;
}